

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounding_box.h
# Opt level: O0

void __thiscall draco::BoundingBox::Update(BoundingBox *this,Vector3f *new_point)

{
  float fVar1;
  Scalar SVar2;
  Scalar *pSVar3;
  int i;
  int in_stack_ffffffffffffffcc;
  Scalar in_stack_ffffffffffffffd0;
  Scalar in_stack_ffffffffffffffd4;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    pSVar3 = VectorD<float,_3>::operator[]
                       ((VectorD<float,_3> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    fVar1 = *pSVar3;
    pSVar3 = VectorD<float,_3>::operator[]
                       ((VectorD<float,_3> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    if (fVar1 < *pSVar3) {
      pSVar3 = VectorD<float,_3>::operator[]
                         ((VectorD<float,_3> *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      SVar2 = *pSVar3;
      pSVar3 = VectorD<float,_3>::operator[]
                         ((VectorD<float,_3> *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      *pSVar3 = SVar2;
    }
    pSVar3 = VectorD<float,_3>::operator[]
                       ((VectorD<float,_3> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    in_stack_ffffffffffffffd4 = *pSVar3;
    pSVar3 = VectorD<float,_3>::operator[]
                       ((VectorD<float,_3> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    if (*pSVar3 <= in_stack_ffffffffffffffd4 && in_stack_ffffffffffffffd4 != *pSVar3) {
      pSVar3 = VectorD<float,_3>::operator[]
                         ((VectorD<float,_3> *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      in_stack_ffffffffffffffd0 = *pSVar3;
      pSVar3 = VectorD<float,_3>::operator[]
                         ((VectorD<float,_3> *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      *pSVar3 = in_stack_ffffffffffffffd0;
    }
  }
  return;
}

Assistant:

void Update(const Vector3f &new_point) {
    for (int i = 0; i < 3; i++) {
      if (new_point[i] < min_point_[i]) {
        min_point_[i] = new_point[i];
      }
      if (new_point[i] > max_point_[i]) {
        max_point_[i] = new_point[i];
      }
    }
  }